

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O0

void __thiscall bloom_filter::insert(bloom_filter *this,uchar *key_begin,size_t *length)

{
  byte bVar1;
  size_t remaining_length;
  ulong uVar2;
  size_t *begin;
  size_type sVar3;
  reference pvVar4;
  byte *pbVar5;
  bloom_type local_3c;
  ulong local_38;
  size_t i;
  size_t bit;
  size_t bit_index;
  size_t *length_local;
  uchar *key_begin_local;
  bloom_filter *this_local;
  
  bit = 0;
  i = 0;
  local_38 = 0;
  bit_index = (size_t)length;
  length_local = (size_t *)key_begin;
  key_begin_local = (uchar *)this;
  while( true ) {
    uVar2 = local_38;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->salt_);
    begin = length_local;
    if (sVar3 <= uVar2) break;
    remaining_length = *(size_t *)bit_index;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->salt_,local_38);
    local_3c = hash_ap(this,(uchar *)begin,remaining_length,*pvVar4);
    (*this->_vptr_bloom_filter[4])(this,&local_3c,&bit,&i);
    bVar1 = bit_mask[i];
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->bit_table_,bit >> 3);
    *pbVar5 = *pbVar5 | bVar1;
    local_38 = local_38 + 1;
  }
  this->inserted_element_count_ = this->inserted_element_count_ + 1;
  return;
}

Assistant:

inline void insert(const unsigned char* key_begin, const std::size_t& length)
   {
      std::size_t bit_index = 0;
      std::size_t bit       = 0;

      for (std::size_t i = 0; i < salt_.size(); ++i)
      {
         compute_indices(hash_ap(key_begin, length, salt_[i]), bit_index, bit);

         bit_table_[bit_index / bits_per_char] |= bit_mask[bit];
      }

      ++inserted_element_count_;
   }